

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

void __thiscall
presolve::HPresolve::computeIntermediateMatrix
          (HPresolve *this,vector<int,_std::allocator<int>_> *flagRow,
          vector<int,_std::allocator<int>_> *flagCol,size_t *numreductions)

{
  byte bVar1;
  HighsPostsolveStack *this_00;
  byte *pbVar2;
  reference pvVar3;
  size_t *in_RCX;
  vector<int,_std::allocator<int>_> *in_RDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  HPresolve *in_RDI;
  HighsInt i_1;
  HighsInt i;
  HighsPostsolveStack stack;
  HighsPostsolveStack *in_stack_fffffffffffffed0;
  int local_114;
  int local_110;
  HighsInt in_stack_fffffffffffffef8;
  HighsInt in_stack_fffffffffffffefc;
  HighsPostsolveStack *in_stack_ffffffffffffff00;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff18;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff20;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff28;
  HPresolve *in_stack_ffffffffffffff30;
  HighsPostsolveStack *in_stack_ffffffffffffffc0;
  HPresolve *in_stack_ffffffffffffffc8;
  
  in_RDI->shrinkProblemEnabled = false;
  HighsPostsolveStack::HighsPostsolveStack(in_stack_fffffffffffffed0);
  std::vector<int,_std::allocator<int>_>::size(in_RSI);
  std::vector<int,_std::allocator<int>_>::size(in_RDX);
  HighsPostsolveStack::initializeIndexMaps
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,in_stack_fffffffffffffef8);
  setReductionLimit(in_RDI,*in_RCX);
  presolve(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  this_00 = (HighsPostsolveStack *)
            HighsPostsolveStack::numReductions((HighsPostsolveStack *)0x7138cc);
  *in_RCX = (size_t)this_00;
  toCSC(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
        in_stack_ffffffffffffff18);
  for (local_110 = 0; local_110 != in_RDI->model->num_row_; local_110 = local_110 + 1) {
    pbVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&in_RDI->rowDeleted,(long)local_110);
    bVar1 = *pbVar2;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RSI,(long)local_110);
    *pvVar3 = 1 - (uint)bVar1;
  }
  for (local_114 = 0; local_114 != in_RDI->model->num_col_; local_114 = local_114 + 1) {
    pbVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&in_RDI->colDeleted,(long)local_114);
    bVar1 = *pbVar2;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(long)local_114);
    *pvVar3 = 1 - (uint)bVar1;
  }
  HighsPostsolveStack::~HighsPostsolveStack(this_00);
  return;
}

Assistant:

void HPresolve::computeIntermediateMatrix(std::vector<HighsInt>& flagRow,
                                          std::vector<HighsInt>& flagCol,
                                          size_t& numreductions) {
  shrinkProblemEnabled = false;
  HighsPostsolveStack stack;
  stack.initializeIndexMaps(flagRow.size(), flagCol.size());
  setReductionLimit(numreductions);
  presolve(stack);
  numreductions = stack.numReductions();

  toCSC(model->a_matrix_.value_, model->a_matrix_.index_,
        model->a_matrix_.start_);

  for (HighsInt i = 0; i != model->num_row_; ++i)
    flagRow[i] = 1 - rowDeleted[i];
  for (HighsInt i = 0; i != model->num_col_; ++i)
    flagCol[i] = 1 - colDeleted[i];
}